

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dtoa.cc
# Opt level: O0

void TestDtoaCorners(void)

{
  int point;
  int length;
  bool sign;
  Vector<char> buffer;
  char buffer_container [100];
  char *pcVar1;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  bool *point_00;
  undefined8 in_stack_ffffffffffffff48;
  int *piVar2;
  int iVar3;
  char *in_stack_ffffffffffffff50;
  bool *point_01;
  int *in_stack_ffffffffffffff58;
  int *length_00;
  bool *in_stack_ffffffffffffff60;
  bool *sign_00;
  int *piVar4;
  Vector<char> in_stack_ffffffffffffff78;
  int *local_78;
  bool *in_stack_ffffffffffffff90;
  char local_68 [104];
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)&local_78,local_68,100);
  pcVar1 = &stack0xffffffffffffff7c;
  piVar4 = local_78;
  sign_00 = in_stack_ffffffffffffff90;
  DoubleToAscii((double)in_stack_ffffffffffffff90,(DtoaMode)((ulong)local_78 >> 0x20),(int)local_78,
                in_stack_ffffffffffffff78,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                (int *)in_stack_ffffffffffffff90);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar3,in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30,
                    (int)((ulong)pcVar1 >> 0x20));
  double_conversion::Vector<char>::start((Vector<char> *)&local_78);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar3,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,pcVar1);
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB81((ulong)pcVar1 >> 0x38,0));
  pcVar1 = &stack0xffffffffffffff7c;
  length_00 = local_78;
  point_01 = sign_00;
  DoubleToAscii((double)in_stack_ffffffffffffff90,(DtoaMode)((ulong)piVar4 >> 0x20),(int)piVar4,
                in_stack_ffffffffffffff78,sign_00,local_78,(int *)sign_00);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar3,in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30,
                    (int)((ulong)pcVar1 >> 0x20));
  double_conversion::Vector<char>::start((Vector<char> *)&local_78);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar3,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,pcVar1);
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB81((ulong)pcVar1 >> 0x38,0));
  pcVar1 = &stack0xffffffffffffff7c;
  piVar2 = local_78;
  point_00 = point_01;
  DoubleToAscii((double)in_stack_ffffffffffffff90,(DtoaMode)((ulong)piVar4 >> 0x20),(int)piVar4,
                in_stack_ffffffffffffff78,sign_00,length_00,(int *)point_01);
  iVar3 = (int)((ulong)piVar2 >> 0x20);
  CheckEqualsHelper(point_01,iVar3,in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30,
                    (int)((ulong)pcVar1 >> 0x20));
  double_conversion::Vector<char>::start((Vector<char> *)&local_78);
  CheckEqualsHelper(point_01,iVar3,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                    in_stack_ffffffffffffff30,pcVar1);
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB81((ulong)pcVar1 >> 0x38,0));
  pcVar1 = &stack0xffffffffffffff7c;
  DoubleToAscii((double)in_stack_ffffffffffffff90,(DtoaMode)((ulong)piVar4 >> 0x20),(int)piVar4,
                in_stack_ffffffffffffff78,sign_00,length_00,(int *)point_00);
  CheckEqualsHelper(point_01,iVar3,point_00,(int)((ulong)local_78 >> 0x20),in_stack_ffffffffffffff30
                    ,(int)((ulong)pcVar1 >> 0x20));
  double_conversion::Vector<char>::start((Vector<char> *)&local_78);
  CheckEqualsHelper(point_01,iVar3,point_00,(char *)local_78,in_stack_ffffffffffffff30,pcVar1);
  CheckHelper(point_00,(int)((ulong)local_78 >> 0x20),in_stack_ffffffffffffff30,
              SUB81((ulong)pcVar1 >> 0x38,0));
  return;
}

Assistant:

TEST(DtoaCorners) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool sign;
  int length;
  int point;

  DoubleToAscii(0.0, PRECISION, 0, buffer, &sign, &length, &point);
  CHECK_EQ(0, length);
  CHECK_EQ("", buffer.start());
  CHECK(!sign);

  DoubleToAscii(1.0, PRECISION, 0, buffer, &sign, &length, &point);
  CHECK_EQ(0, length);
  CHECK_EQ("", buffer.start());
  CHECK(!sign);

  DoubleToAscii(0.0, FIXED, 0, buffer, &sign, &length, &point);
  CHECK_EQ(1, length);
  CHECK_EQ("0", buffer.start());
  CHECK(!sign);

  DoubleToAscii(1.0, FIXED, 0, buffer, &sign, &length, &point);
  CHECK_EQ(1, length);
  CHECK_EQ("1", buffer.start());
  CHECK(!sign);
}